

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Equals * __thiscall Catch::Matchers::Impl::StdString::Equals::toString_abi_cxx11_(Equals *this)

{
  CasedString local_88;
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  Equals *this_local;
  
  this_local = this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"equals: \"");
  std::operator+(local_38,(char *)local_58);
  CasedString::toStringSuffix_abi_cxx11_(&local_88);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,local_38)
  ;
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

virtual std::string toString() const {
                return "equals: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }